

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.hpp
# Opt level: O1

matrix<trng::GF2,_521UL> *
trng::operator*(matrix<trng::GF2,_521UL> *__return_storage_ptr__,matrix<trng::GF2,_521UL> *a,
               matrix<trng::GF2,_521UL> *b)

{
  long lVar1;
  pointer pGVar2;
  size_type j_end_1;
  pointer __s;
  ulong uVar3;
  pointer pGVar4;
  pointer pGVar5;
  byte bVar6;
  size_type j_end;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  pointer pGVar12;
  pointer pGVar13;
  size_type i;
  pointer pGVar14;
  size_type j0;
  ulong uVar15;
  pointer pGVar16;
  ulong uVar17;
  bool bVar18;
  pointer local_68;
  
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __s = (pointer)operator_new(0x42451);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = __s;
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x42451;
  lVar9 = 0;
  memset(__s,0,0x42451);
  (__return_storage_ptr__->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x42451;
  pGVar2 = (a->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar16 = (b->data).super__Vector_base<trng::GF2,_std::allocator<trng::GF2>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar15 = 0;
  local_68 = __s;
  do {
    uVar3 = 0x1e9;
    if (uVar15 < 0x1e9) {
      uVar3 = uVar15;
    }
    lVar7 = -0x42451;
    do {
      if (uVar15 < uVar3 + 0x20) {
        memset(local_68 + lVar7 + 0x42451,0,uVar3 + lVar9 * -0x20 + 0x20);
      }
      lVar7 = lVar7 + 0x209;
    } while (lVar7 != 0);
    uVar3 = 0x1e9;
    if (uVar15 < 0x1e9) {
      uVar3 = uVar15;
    }
    pGVar5 = pGVar16;
    uVar10 = 0;
    pGVar13 = pGVar2;
    do {
      uVar11 = 0x1e9;
      if (uVar10 < 0x1e9) {
        uVar11 = uVar10;
      }
      lVar7 = 0;
      pGVar12 = pGVar13;
      do {
        if (uVar15 < uVar3 + 0x20) {
          pGVar4 = pGVar5;
          uVar17 = uVar15;
          do {
            if (uVar10 < uVar11 + 0x20) {
              lVar8 = 0;
              bVar6 = 0;
              pGVar14 = pGVar4;
              do {
                bVar6 = bVar6 ^ pGVar14->value & pGVar12[lVar8].value;
                lVar1 = uVar10 + lVar8;
                lVar8 = lVar8 + 1;
                pGVar14 = pGVar14 + 0x209;
              } while (lVar1 + 1U < uVar11 + 0x20);
            }
            else {
              bVar6 = 0;
            }
            __s[uVar17 + lVar7 * 0x209].value = __s[uVar17 + lVar7 * 0x209].value ^ bVar6;
            uVar17 = uVar17 + 1;
            pGVar4 = pGVar4 + 1;
          } while (uVar17 < uVar3 + 0x20);
        }
        lVar7 = lVar7 + 1;
        pGVar12 = pGVar12 + 0x209;
      } while (lVar7 != 0x209);
      pGVar13 = pGVar13 + 0x20;
      pGVar5 = pGVar5 + 0x4120;
      bVar18 = uVar10 < 0x1e9;
      uVar10 = uVar10 + 0x20;
    } while (bVar18);
    uVar15 = uVar15 + 0x20;
    lVar9 = lVar9 + 1;
    local_68 = local_68 + 0x20;
    pGVar16 = pGVar16 + 0x20;
  } while (lVar9 != 0x11);
  return __return_storage_ptr__;
}

Assistant:

matrix<T, n> operator*(const matrix<T, n> &a, const matrix<T, n> &b) {
    using size_type = typename matrix<T, n>::size_type;
    matrix<T, n> res;
    const size_type step{32};
    for (size_type j0{0}; j0 < n; j0 += step) {
      for (size_type i{0}; i < n; ++i)
        for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j)
          res(i, j) = T{0};
      for (size_type k0{0}; k0 < n; k0 += step) {
        for (size_type i{0}; i < n; ++i)
          for (size_type j{j0}, j_end{utility::min(n, j0 + step)}; j < j_end; ++j) {
            T sum{0};
            for (size_type k{k0}, k_end{utility::min(n, k0 + step)}; k < k_end; ++k)
              sum = sum + a(i, k) * b(k, j);
            res(i, j) = res(i, j) + sum;
          }
      }
    }
    return res;
  }